

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

bool __thiscall
Js::FunctionBody::ProbeAtOffset(FunctionBody *this,int offset,OpCode *pOriginalOpcode)

{
  code *pcVar1;
  bool bVar2;
  OpCode OVar3;
  OpCode OVar4;
  uint uVar5;
  byte *pbVar6;
  undefined4 *puVar7;
  
  if ((this->m_sourceInfo).m_probeBackingBlock.ptr != (ByteBlock *)0x0) {
    if ((-1 < offset) &&
       (uVar5 = ByteBlock::GetLength((this->byteCodeBlock).ptr), offset + 1U < uVar5)) {
      pbVar6 = ByteBlock::GetBuffer((this->byteCodeBlock).ptr);
      OVar3 = ByteCodeReader::PeekByteOp(pbVar6 + (uint)offset);
      pbVar6 = ByteBlock::GetBuffer((this->m_sourceInfo).m_probeBackingBlock.ptr);
      OVar4 = ByteCodeReader::PeekByteOp(pbVar6 + (uint)offset);
      if (OVar3 == OVar4) {
        return OVar3 != OVar4;
      }
      *pOriginalOpcode = OVar4;
      return true;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x103a,"(false)","ProbeAtOffset called with out of bounds offset");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar7 = 0;
  }
  return false;
}

Assistant:

bool FunctionBody::ProbeAtOffset(int offset, OpCode* pOriginalOpcode)
    {
        if (!GetProbeBackingBlock())
        {
            return false;
        }

        if (offset < 0 || ((uint)offset + 1) >= this->byteCodeBlock->GetLength())
        {
            AssertMsg(false, "ProbeAtOffset called with out of bounds offset");
            return false;
        }

        Js::OpCode runningOpCode = ByteCodeReader::PeekByteOp(this->byteCodeBlock->GetBuffer() + offset);
        Js::OpCode originalOpcode = ByteCodeReader::PeekByteOp(GetProbeBackingBlock()->GetBuffer() + offset);

        if ( runningOpCode != originalOpcode)
        {
            *pOriginalOpcode = originalOpcode;
            return true;
        }
        else
        {
            // e.g. inline break or a step hit and is checking for a bp
            return false;
        }
    }